

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::anon_unknown_6::GetTerminalAttributeImpl
               (Stage *stage,Prim *prim,string *attr_name,Attribute *value,string *err,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *visited_paths)

{
  Prim *prim_00;
  bool bVar1;
  ostream *poVar2;
  value_type *ppPVar3;
  size_type sVar4;
  error_type *peVar5;
  string *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *pcVar7;
  allocator local_961;
  Attribute *local_960;
  expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  targetPrimRet;
  string targetPrimPath;
  string abs_path;
  string local_8f0;
  string targetPrimPropName;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> pv;
  value_type target;
  ostringstream ss_e;
  string local_650;
  string local_630 [32];
  Property prop;
  
  local_960 = value;
  Property::Property(&prop);
  args = err;
  bVar1 = GetProperty(prim,attr_name,&prop,err);
  if (bVar1) {
    bVar1 = Property::is_attribute_connection(&prop);
    if (bVar1) {
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                (&pv,&prop._attrib._paths);
      if (pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_start ==
          pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"GetTerminalAttributeImpl");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xae3);
        ::std::operator<<(poVar2," ");
        ::std::__cxx11::string::string
                  ((string *)&targetPrimRet,"Connection targetPath is empty for Attribute {}.",
                   (allocator *)&targetPrimPath);
        fmt::format<std::__cxx11::string>
                  ((string *)&target,(fmt *)&targetPrimRet,(string *)attr_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&target);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::_M_dispose();
LAB_0027b62e:
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)err);
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        bVar1 = false;
      }
      else {
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xd0;
        if (1 < (ulong)(((long)pv.
                               super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xd0)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"GetTerminalAttributeImpl");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xae8);
          ::std::operator<<(poVar2," ");
          ::std::__cxx11::string::string
                    ((string *)&targetPrimRet,"Multiple targetPaths assigned to .connection.",
                     (allocator *)&targetPrimPath);
          fmt::format(&target._prim_part,(string *)&targetPrimRet);
          poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&target);
          ::std::operator<<(poVar2,"\n");
          ::std::__cxx11::string::_M_dispose();
          goto LAB_0027b62e;
        }
        Path::Path(&target,pv.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                           _M_impl.super__Vector_impl_data._M_start);
        ::std::__cxx11::string::string((string *)&targetPrimPath,(string *)&target);
        ::std::__cxx11::string::string((string *)&targetPrimPropName,(string *)&target._prop_part);
        ::std::__cxx11::string::string((string *)&abs_path,"",(allocator *)&local_8f0);
        Path::Path((Path *)&ss_e,&targetPrimPath,&abs_path);
        Stage::GetPrimAtPath_abi_cxx11_(&targetPrimRet,stage,(Path *)&ss_e);
        Path::~Path((Path *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        if (targetPrimRet.contained.
            super_storage_t_impl<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .m_has_value == true) {
          ppPVar3 = nonstd::expected_lite::
                    expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::value(&targetPrimRet);
          prim_00 = *ppPVar3;
          Path::full_path_name_abi_cxx11_(&abs_path,&target);
          sVar4 = ::std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(visited_paths,&abs_path);
          if (sVar4 == 0) {
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)visited_paths,&abs_path);
            bVar1 = GetTerminalAttributeImpl
                              (stage,prim_00,&targetPrimPropName,local_960,err,visited_paths);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"GetTerminalAttributeImpl");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xafe);
            ::std::operator<<(poVar2," ");
            ::std::__cxx11::string::string
                      (local_630,"Circular referencing detected. connectionTargetPath = {}",
                       &local_961);
            tinyusdz::to_string_abi_cxx11_
                      (&local_650,(tinyusdz *)&target,(Path *)0x1,SUB81(pbVar6,0));
            fmt::format<std::__cxx11::string>
                      (&local_8f0,(fmt *)local_630,(string *)&local_650,pbVar6);
            poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&local_8f0);
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)err);
              ::std::__cxx11::string::_M_dispose();
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            bVar1 = false;
          }
          ::std::__cxx11::string::_M_dispose();
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar2 = ::std::operator<<(poVar2,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                    );
          poVar2 = ::std::operator<<(poVar2,":");
          poVar2 = ::std::operator<<(poVar2,"GetTerminalAttributeImpl");
          poVar2 = ::std::operator<<(poVar2,"():");
          poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb06);
          ::std::operator<<(poVar2," ");
          peVar5 = nonstd::expected_lite::
                   expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::error(&targetPrimRet);
          poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)peVar5);
          ::std::operator<<(poVar2,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)err);
            ::std::__cxx11::string::_M_dispose();
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          bVar1 = false;
        }
        nonstd::expected_lite::
        expected<const_tinyusdz::Prim_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~expected(&targetPrimRet);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        Path::~Path(&target);
      }
      ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&pv);
      goto LAB_0027bae6;
    }
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(prop._type & ~Attrib);
    if ((prop._type & ~Attrib) == Relation) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"GetTerminalAttributeImpl");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb0a);
      ::std::operator<<(poVar2," ");
      pcVar7 = "Property `{}` is a Relation.";
    }
    else {
      if (prop._type == Attrib) {
        Attribute::operator=(local_960,&prop._attrib);
        bVar1 = true;
        goto LAB_0027bae6;
      }
      if (prop._type == EmptyAttrib) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"GetTerminalAttributeImpl");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb0e);
        ::std::operator<<(poVar2," ");
        pcVar7 = "Attribute `{}` is a define-only attribute(no value assigned).";
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar2 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/scene-access.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"GetTerminalAttributeImpl");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xb15);
        ::std::operator<<(poVar2," ");
        pcVar7 = "[InternalError] Invalid Attribute `{}`.";
      }
    }
    ::std::__cxx11::string::string((string *)&targetPrimRet,pcVar7,(allocator *)&targetPrimPath);
    fmt::format<std::__cxx11::string>
              ((string *)&target,(fmt *)&targetPrimRet,(string *)attr_name,pbVar6);
    poVar2 = ::std::operator<<((ostream *)&ss_e,(string *)&target);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  }
  bVar1 = false;
LAB_0027bae6:
  Property::~Property(&prop);
  return bVar1;
}

Assistant:

bool GetTerminalAttributeImpl(const tinyusdz::Stage &stage,
                              const tinyusdz::Prim &prim,
                              const std::string &attr_name, Attribute *value,
                              std::string *err,
                              std::set<std::string> &visited_paths) {
  DCOUT("Prim : " << prim.element_path().element_name() << "("
                  << prim.type_name() << ") attr_name " << attr_name);

  Property prop;
  if (!GetProperty(prim, attr_name, &prop, err)) {
    return false;
  }

  if (prop.is_attribute_connection()) {
    // Follow connection target Path(singple targetPath only).
    std::vector<Path> pv = prop.get_attribute().connections();
    if (pv.empty()) {
      PUSH_ERROR_AND_RETURN(fmt::format(
          "Connection targetPath is empty for Attribute {}.", attr_name));
    }

    if (pv.size() > 1) {
      PUSH_ERROR_AND_RETURN(
          fmt::format("Multiple targetPaths assigned to .connection."));
    }

    auto target = pv[0];

    std::string targetPrimPath = target.prim_part();
    std::string targetPrimPropName = target.prop_part();
    DCOUT("connection targetPath : " << target << "(Prim: " << targetPrimPath
                                     << ", Prop: " << targetPrimPropName
                                     << ")");

    auto targetPrimRet =
        stage.GetPrimAtPath(Path(targetPrimPath, /* prop */ ""));
    if (targetPrimRet) {
      // Follow the connetion
      const Prim *targetPrim = targetPrimRet.value();

      std::string abs_path = target.full_path_name();

      if (visited_paths.count(abs_path)) {
        PUSH_ERROR_AND_RETURN(fmt::format(
            "Circular referencing detected. connectionTargetPath = {}",
            to_string(target)));
      }
      visited_paths.insert(abs_path);

      return GetTerminalAttributeImpl(stage, *targetPrim, targetPrimPropName,
                                      value, err, visited_paths);

    } else {
      PUSH_ERROR_AND_RETURN(targetPrimRet.error());
    }
  } else if (prop.is_relationship()) {
    PUSH_ERROR_AND_RETURN(
        fmt::format("Property `{}` is a Relation.", attr_name));
  } else if (prop.is_empty()) {
    PUSH_ERROR_AND_RETURN(fmt::format(
        "Attribute `{}` is a define-only attribute(no value assigned).",
        attr_name));
  } else if (prop.is_attribute()) {
    (*value) = prop.get_attribute();

  } else {
    // ???
    PUSH_ERROR_AND_RETURN(
        fmt::format("[InternalError] Invalid Attribute `{}`.", attr_name));
  }

  return true;
}